

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status google::protobuf::(anonymous_namespace)::
       Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                 (char *args,basic_string_view<char,_std::char_traits<char>_> args_1,char *args_2,
                 basic_string_view<char,_std::char_traits<char>_> args_3,char *args_4)

{
  char *__s;
  char *__s_00;
  char *__s_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view message;
  size_t local_c0;
  string local_a0;
  size_t local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  char *local_50;
  size_t local_40;
  char *local_38;
  
  __s_01 = args_3._M_str;
  __s_00 = (char *)args_3._M_len;
  __s = (char *)args_1._M_len;
  if (__s == (char *)0x0) {
    local_c0 = 0;
    __s = (char *)0x0;
  }
  else {
    local_c0 = strlen(__s);
  }
  if (__s_00 == (char *)0x0) {
    local_60 = 0;
    __s_00 = (char *)0x0;
  }
  else {
    local_60 = strlen(__s_00);
  }
  if (__s_01 == (char *)0x0) {
    local_40 = 0;
    __s_01 = (char *)0x0;
  }
  else {
    local_40 = strlen(__s_01);
  }
  local_80 = local_c0;
  local_50 = args_4;
  pieces._M_len = (size_type)args_2;
  pieces._M_array = (iterator)&DAT_00000005;
  local_78 = __s;
  local_70 = args_1._M_str;
  local_68 = args_2;
  local_58 = __s_00;
  local_38 = __s_01;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            (&local_a0,(strings_internal *)&local_80,pieces);
  message._M_str = (char *)local_a0._M_string_length;
  message._M_len = (size_t)args;
  absl::lts_20250127::FailedPreconditionError(message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return (Status)(uintptr_t)args;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}